

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O0

Error asmjit::v1_14::VirtMem::asmjitErrorFromErrno(int e)

{
  int e_local;
  Error local_4;
  
  switch(e) {
  case 1:
  case 0xb:
  case 0xd:
  case 0x13:
    local_4 = 3;
    break;
  default:
    local_4 = 2;
    break;
  case 0xc:
  case 0x1b:
  case 0x4b:
    local_4 = 1;
    break;
  case 0x17:
  case 0x18:
    local_4 = 8;
  }
  return local_4;
}

Assistant:

ASMJIT_MAYBE_UNUSED
static Error asmjitErrorFromErrno(int e) noexcept {
  switch (e) {
    case EACCES:
    case EAGAIN:
    case ENODEV:
    case EPERM:
      return kErrorInvalidState;

    case EFBIG:
    case ENOMEM:
    case EOVERFLOW:
      return kErrorOutOfMemory;

    case EMFILE:
    case ENFILE:
      return kErrorTooManyHandles;

    default:
      return kErrorInvalidArgument;
  }
}